

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

bool AM_Responder(event_t *ev,bool last)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *defbind_1;
  bool res;
  char *defbind;
  bool last_local;
  event_t *ev_local;
  
  if ((automapactive) && ((ev->type == '\x01' || (ev->type == '\x02')))) {
    bVar1 = FBoolCVar::operator_cast_to_bool(&am_followplayer);
    if (bVar1) {
      pcVar3 = FKeyBindings::GetBind(&AutomapBindings,(int)ev->data1);
      iVar2 = strncasecmp(pcVar3,"+am_pan",7);
      if (iVar2 == 0) {
        return false;
      }
    }
    ev_local._7_1_ = C_DoKey(ev,&AutomapBindings,(FKeyBindings *)0x0);
    if (((ev_local._7_1_) && (ev->type == '\x02')) && (!last)) {
      pcVar3 = FKeyBindings::GetBind(&Bindings,(int)ev->data1);
      ev_local._7_1_ = *pcVar3 != '+';
    }
  }
  else {
    ev_local._7_1_ = false;
  }
  return ev_local._7_1_;
}

Assistant:

bool AM_Responder (event_t *ev, bool last)
{
	if (automapactive && (ev->type == EV_KeyDown || ev->type == EV_KeyUp))
	{
		if (am_followplayer)
		{
			// check for am_pan* and ignore in follow mode
			const char *defbind = AutomapBindings.GetBind(ev->data1);
			if (!strnicmp(defbind, "+am_pan", 7)) return false;
		}

		bool res = C_DoKey(ev, &AutomapBindings, NULL);
		if (res && ev->type == EV_KeyUp && !last)
		{
			// If this is a release event we also need to check if it released a button in the main Bindings
			// so that that button does not get stuck.
			const char *defbind = Bindings.GetBind(ev->data1);
			return (defbind[0] != '+'); // Let G_Responder handle button releases
		}
		return res;
	}
	return false;
}